

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O0

int16_t * __thiscall
sptk::reaper::EpochTracker::HighpassFilter
          (EpochTracker *this,int16_t *input,int32_t n_input,float sample_rate,float corner_freq,
          float fir_duration)

{
  int iVar1;
  int16_t *piVar2;
  int in_EDX;
  ulong uVar3;
  ulong uVar4;
  int32_t samples_returned;
  int32_t to_send;
  int32_t output_index;
  int32_t input_index;
  bool end;
  bool start;
  int32_t to_process;
  int32_t max_buffer_size;
  int16_t *filtered_data;
  FdFilter filter;
  bool in_stack_fffffffffffffeff;
  float in_stack_ffffffffffffff00;
  bool in_stack_ffffffffffffff07;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int local_dc;
  int local_cc;
  int16_t *in_stack_ffffffffffffff40;
  FdFilter *in_stack_ffffffffffffff50;
  FdFilter *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff70;
  
  FdFilter::FdFilter((FdFilter *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (float)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                     (float)in_stack_ffffffffffffff08,in_stack_ffffffffffffff07,
                     in_stack_ffffffffffffff00,in_stack_fffffffffffffeff);
  uVar3 = (ulong)in_EDX;
  uVar4 = uVar3 * 2;
  if (CARRY8(uVar3,uVar3)) {
    uVar4 = 0xffffffffffffffff;
  }
  piVar2 = (int16_t *)operator_new__(uVar4);
  iVar1 = FdFilter::GetMaxInputSize((FdFilter *)&stack0xffffffffffffff50);
  for (local_cc = in_EDX; 0 < local_cc; local_cc = local_cc - local_dc) {
    local_dc = local_cc;
    if (iVar1 < local_cc) {
      local_dc = iVar1;
    }
    FdFilter::FilterArray
              (in_stack_ffffffffffffff58,(int16_t *)in_stack_ffffffffffffff50,
               (int)((ulong)piVar2 >> 0x20),SUB81((ulong)piVar2 >> 0x18,0),
               SUB81((ulong)piVar2 >> 0x10,0),in_stack_ffffffffffffff40,in_stack_ffffffffffffff70);
  }
  FdFilter::~FdFilter(in_stack_ffffffffffffff50);
  return piVar2;
}

Assistant:

int16_t* EpochTracker::HighpassFilter(int16_t* input, int32_t n_input,
                                      float sample_rate, float corner_freq,
				      float fir_duration) {
  FdFilter filter(sample_rate, corner_freq, true, fir_duration, false);
  int16_t* filtered_data = new int16_t[n_input];
  int32_t max_buffer_size = filter.GetMaxInputSize();
  int32_t to_process = n_input;
  bool start = true;
  bool end = false;
  int32_t input_index = 0;
  int32_t output_index = 0;
  while (to_process > 0) {
    int32_t to_send = to_process;
    if (to_send > max_buffer_size) {
      to_send = max_buffer_size;
    } else {
      end = true;
    }
    int32_t samples_returned = filter.FilterArray(input + input_index, to_send,
                                                  start, end,
                                                  filtered_data + output_index,
                                                  n_input - output_index);
    input_index += to_send;
    to_process -= to_send;
    output_index += samples_returned;
    start = false;
  }
  return filtered_data;
}